

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pageFreeArray(MemPage *pPg,int iFirst,int nCell,CellArray *pCArray)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  u8 *puVar4;
  u8 *puVar5;
  int iVar6;
  ulong uVar7;
  u8 *puVar8;
  long lVar9;
  int iVar10;
  
  if (nCell < 1) {
LAB_0016897a:
    iVar10 = 0;
  }
  else {
    puVar4 = pPg->aData;
    uVar3 = pPg->pBt->usableSize;
    bVar1 = pPg->hdrOffset;
    bVar2 = pPg->childPtrSize;
    lVar9 = (long)iFirst;
    iVar10 = 0;
    iVar6 = 0;
    puVar8 = (u8 *)0x0;
    do {
      puVar5 = pCArray->apCell[lVar9];
      if ((puVar4 + (ulong)bVar2 + (ulong)bVar1 + 8 <= puVar5) && (puVar5 < puVar4 + uVar3)) {
        uVar7 = (ulong)pCArray->szCell[lVar9];
        if (puVar8 == puVar5 + uVar7) {
          uVar7 = (ulong)(iVar6 + (uint)pCArray->szCell[lVar9]);
        }
        else {
          if (puVar8 != (u8 *)0x0) {
            freeSpace(pPg,(short)puVar8 - (short)puVar4,(u16)iVar6);
          }
          if (puVar4 + uVar3 < puVar5 + uVar7) goto LAB_0016897a;
        }
        iVar10 = iVar10 + 1;
        iVar6 = (int)uVar7;
        puVar8 = puVar5;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < nCell + iFirst);
    if (puVar8 != (u8 *)0x0) {
      freeSpace(pPg,(short)puVar8 - (short)puVar4,(u16)iVar6);
    }
  }
  return iVar10;
}

Assistant:

static int pageFreeArray(
  MemPage *pPg,                   /* Page to edit */
  int iFirst,                     /* First cell to delete */
  int nCell,                      /* Cells to delete */
  CellArray *pCArray              /* Array of cells */
){
  u8 * const aData = pPg->aData;
  u8 * const pEnd = &aData[pPg->pBt->usableSize];
  u8 * const pStart = &aData[pPg->hdrOffset + 8 + pPg->childPtrSize];
  int nRet = 0;
  int i;
  int iEnd = iFirst + nCell;
  u8 *pFree = 0;
  int szFree = 0;

  for(i=iFirst; i<iEnd; i++){
    u8 *pCell = pCArray->apCell[i];
    if( SQLITE_WITHIN(pCell, pStart, pEnd) ){
      int sz;
      /* No need to use cachedCellSize() here.  The sizes of all cells that
      ** are to be freed have already been computing while deciding which
      ** cells need freeing */
      sz = pCArray->szCell[i];  assert( sz>0 );
      if( pFree!=(pCell + sz) ){
        if( pFree ){
          assert( pFree>aData && (pFree - aData)<65536 );
          freeSpace(pPg, (u16)(pFree - aData), szFree);
        }
        pFree = pCell;
        szFree = sz;
        if( pFree+sz>pEnd ){
          return 0;
        }
      }else{
        pFree = pCell;
        szFree += sz;
      }
      nRet++;
    }
  }
  if( pFree ){
    assert( pFree>aData && (pFree - aData)<65536 );
    freeSpace(pPg, (u16)(pFree - aData), szFree);
  }
  return nRet;
}